

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::Hub::~Hub(Hub *this)

{
  int *piVar1;
  _Base_ptr p_Var2;
  
  this->_vptr_Hub = (_func_int **)&PTR__Hub_001252a8;
  piVar1 = (int *)this->hTerminate;
  close(*piVar1);
  close(piVar1[1]);
  operator_delete__(piVar1);
  for (p_Var2 = (this->streams)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->streams)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(long **)(p_Var2 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var2 + 1) + 8))();
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)this->streamsLock);
  operator_delete(this->streamsLock,0x28);
  std::
  _Rb_tree<Dashel::Stream_*,_Dashel::Stream_*,_std::_Identity<Dashel::Stream_*>,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>
  ::~_Rb_tree(&(this->dataStreams)._M_t);
  std::
  _Rb_tree<Dashel::Stream_*,_Dashel::Stream_*,_std::_Identity<Dashel::Stream_*>,_std::less<Dashel::Stream_*>,_std::allocator<Dashel::Stream_*>_>
  ::~_Rb_tree(&(this->streams)._M_t);
  return;
}

Assistant:

Hub::~Hub()
	{
		int* terminationPipes = (int*)hTerminate;
		close(terminationPipes[0]);
		close(terminationPipes[1]);
		delete[] terminationPipes;

		for (StreamsSet::iterator it = streams.begin(); it != streams.end(); ++it)
			delete *it;

		pthread_mutex_destroy((pthread_mutex_t*)streamsLock);

		delete (pthread_mutex_t*)streamsLock;
	}